

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

int djgt__log2(int x)

{
  undefined4 local_14;
  undefined4 local_10;
  int e;
  int p;
  int x_local;
  
  local_10 = djgt__exp2(x);
  local_14 = 0;
  for (; (local_10 & 1) == 0; local_10 = (int)local_10 >> 1) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

static int djgt__log2(int x)
{
    int p = djgt__exp2(x);
    int e = 0;

    while (! (p & 1)) {
        p >>= 1;
        ++e;
    }
    return e;
}